

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
tf::detail::
partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (uint *begin,uint *end,ulong param_3)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  int __tmp;
  ulong uVar9;
  long lVar10;
  ulong extraout_RDX;
  ulong uVar11;
  uint *puVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  uint *puVar13;
  ulong uVar14;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar15;
  uchar offsets_r_storage [128];
  uchar offsets_l_storage [128];
  long local_180;
  byte local_101 [128];
  byte abStack_81 [81];
  
  uVar3 = *begin;
  lVar6 = 0;
  do {
    uVar4 = *(uint *)((long)begin + lVar6 + 4);
    lVar6 = lVar6 + 4;
  } while ((int)uVar4 < (int)uVar3);
  puVar2 = (uint *)((long)begin + lVar6);
  puVar12 = end;
  if (lVar6 == 4) {
    do {
      if (end <= puVar2) break;
      puVar12 = end + -1;
      puVar13 = end + -1;
      end = puVar12;
    } while ((int)uVar3 <= (int)*puVar13);
  }
  else {
    do {
      end = puVar12 + -1;
      puVar13 = puVar12 + -1;
      puVar12 = end;
    } while ((int)uVar3 <= (int)*puVar13);
  }
  puVar12 = puVar2;
  if (puVar2 < end) {
    param_3 = (ulong)*end;
    puVar12 = (uint *)((long)begin + lVar6) + 1;
    *(uint *)((long)begin + lVar6) = *end;
    *end = uVar4;
    uVar11 = 0;
    uVar14 = 0;
    lVar6 = 0;
    local_180 = 0;
    first._M_current = (int *)puVar12;
    last._M_current = (int *)end;
    puVar13 = end;
    while (puVar12 < puVar13) {
      uVar7 = (long)puVar13 - (long)puVar12 >> 2;
      uVar9 = uVar7 >> (uVar14 == 0);
      if (uVar11 != 0) {
        uVar9 = 0;
      }
      uVar7 = uVar7 - uVar9;
      if (uVar14 != 0) {
        uVar7 = 0;
      }
      if (uVar9 < 0x40) {
        for (bVar8 = 0; bVar8 < (byte)uVar9; bVar8 = bVar8 + 1) {
          abStack_81[uVar11 + 1] = bVar8;
          uVar11 = uVar11 + ((int)uVar3 <= (int)*puVar12);
          puVar12 = puVar12 + 1;
        }
      }
      else {
        for (bVar8 = 0; bVar8 < 0x40; bVar8 = bVar8 + 8) {
          abStack_81[uVar11 + 1] = bVar8;
          lVar10 = ((int)uVar3 <= (int)*puVar12) + uVar11;
          abStack_81[lVar10 + 1] = bVar8 + 1;
          lVar10 = (ulong)((int)uVar3 <= (int)puVar12[1]) + lVar10;
          abStack_81[lVar10 + 1] = bVar8 + 2;
          lVar10 = (ulong)((int)uVar3 <= (int)puVar12[2]) + lVar10;
          abStack_81[lVar10 + 1] = bVar8 + 3;
          lVar10 = (ulong)((int)uVar3 <= (int)puVar12[3]) + lVar10;
          abStack_81[lVar10 + 1] = bVar8 + 4;
          lVar10 = (ulong)((int)uVar3 <= (int)puVar12[4]) + lVar10;
          abStack_81[lVar10 + 1] = bVar8 + 5;
          lVar10 = (ulong)((int)uVar3 <= (int)puVar12[5]) + lVar10;
          abStack_81[lVar10 + 1] = bVar8 + 6;
          lVar10 = (ulong)((int)uVar3 <= (int)puVar12[6]) + lVar10;
          abStack_81[lVar10 + 1] = bVar8 + 7;
          uVar11 = (ulong)((int)uVar3 <= (int)puVar12[7]) + lVar10;
          puVar12 = puVar12 + 8;
        }
      }
      if (uVar7 < 0x40) {
        bVar8 = 0;
        while (bVar8 < (byte)uVar7) {
          bVar8 = bVar8 + 1;
          local_101[uVar14 + 1] = bVar8;
          puVar1 = puVar13 + -1;
          puVar13 = puVar13 + -1;
          uVar14 = uVar14 + ((int)*puVar1 < (int)uVar3);
        }
      }
      else {
        bVar8 = 0;
        while (bVar8 < 0x40) {
          local_101[uVar14 + 1] = bVar8 + 1;
          lVar10 = ((int)puVar13[-1] < (int)uVar3) + uVar14;
          local_101[lVar10 + 1] = bVar8 + 2;
          lVar10 = (ulong)((int)puVar13[-2] < (int)uVar3) + lVar10;
          local_101[lVar10 + 1] = bVar8 + 3;
          lVar10 = (ulong)((int)puVar13[-3] < (int)uVar3) + lVar10;
          local_101[lVar10 + 1] = bVar8 + 4;
          lVar10 = (ulong)((int)puVar13[-4] < (int)uVar3) + lVar10;
          local_101[lVar10 + 1] = bVar8 + 5;
          lVar10 = (ulong)((int)puVar13[-5] < (int)uVar3) + lVar10;
          local_101[lVar10 + 1] = bVar8 + 6;
          lVar10 = (ulong)((int)puVar13[-6] < (int)uVar3) + lVar10;
          local_101[lVar10 + 1] = bVar8 + 7;
          lVar10 = (ulong)((int)puVar13[-7] < (int)uVar3) + lVar10;
          bVar8 = bVar8 + 8;
          local_101[lVar10 + 1] = bVar8;
          puVar1 = puVar13 + -8;
          puVar13 = puVar13 + -8;
          uVar14 = (ulong)((int)*puVar1 < (int)uVar3) + lVar10;
        }
      }
      uVar7 = uVar11;
      if (uVar14 < uVar11) {
        uVar7 = uVar14;
      }
      lVar10 = local_180 + 1;
      local_180 = local_180 + uVar7;
      _Var5._M_current = first._M_current;
      if (uVar11 <= uVar14) {
        local_180 = 0;
        _Var5._M_current = (int *)puVar12;
      }
      swap_offsets<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (first,last,abStack_81 + lVar10,local_101 + lVar6 + 1,uVar7,uVar11 == uVar14);
      uVar11 = uVar11 - uVar7;
      lVar6 = lVar6 + uVar7;
      uVar14 = uVar14 - uVar7;
      param_3 = extraout_RDX;
      first._M_current = _Var5._M_current;
      if (uVar14 == 0) {
        lVar6 = 0;
        last._M_current = (int *)puVar13;
      }
    }
    if (uVar11 != 0) {
      while (puVar12 = puVar13, uVar11 != 0) {
        param_3 = (ulong)abStack_81[uVar11 + local_180];
        uVar4 = first._M_current[param_3];
        first._M_current[param_3] = puVar12[-1];
        puVar12[-1] = uVar4;
        uVar11 = uVar11 - 1;
        puVar13 = puVar12 + -1;
      }
    }
    if (uVar14 != 0) {
      while (uVar14 != 0) {
        uVar4 = last._M_current[-(ulong)local_101[uVar14 + lVar6]];
        param_3 = (ulong)uVar4;
        last._M_current[-(ulong)local_101[uVar14 + lVar6]] = *puVar12;
        *puVar12 = uVar4;
        puVar12 = puVar12 + 1;
        uVar14 = uVar14 - 1;
      }
    }
  }
  pVar15._9_7_ = (undefined7)(param_3 >> 8);
  pVar15.second = end <= puVar2;
  *begin = puVar12[-1];
  puVar12[-1] = uVar3;
  pVar15.first._M_current = (int *)(puVar12 + -1);
  return pVar15;
}

Assistant:

std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {

  typedef typename std::iterator_traits<Iter>::value_type T;

  constexpr size_t block_size = 64;
  constexpr size_t cacheline_size = 64;

  // Move pivot into local for speed.
  T pivot(std::move(*begin));
  Iter first = begin;
  Iter last = end;

  // Find the first element greater than or equal than the pivot (the median of 3 guarantees
  // this exists).
  while (comp(*++first, pivot));

  // Find the first element strictly smaller than the pivot. We have to guard this search if
  // there was no element before *first.
  if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
  else                    while (                !comp(*--last, pivot));

  // If the first pair of elements that should be swapped to partition are the same element,
  // the passed in sequence already was correctly partitioned.
  bool already_partitioned = first >= last;
  if (!already_partitioned) {
    std::iter_swap(first, last);
    ++first;

    // The following branchless partitioning is derived from "BlockQuicksort: How Branch
    // Mispredictions don't affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
    // heavily micro-optimized.
    unsigned char offsets_l_storage[block_size + cacheline_size];
    unsigned char offsets_r_storage[block_size + cacheline_size];
    unsigned char* offsets_l = align_cacheline(offsets_l_storage);
    unsigned char* offsets_r = align_cacheline(offsets_r_storage);

    Iter offsets_l_base = first;
    Iter offsets_r_base = last;
    size_t num_l, num_r, start_l, start_r;
    num_l = num_r = start_l = start_r = 0;

    while (first < last) {
      // Fill up offset blocks with elements that are on the wrong side.
      // First we determine how much elements are considered for each offset block.
      size_t num_unknown = last - first;
      size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
      size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

      // Fill the offset blocks.
      if (left_split >= block_size) {
        for (unsigned char i = 0; i < block_size;) {
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
        }
      } else {
        for (unsigned char i = 0; i < left_split;) {
          offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
        }
      }

      if (right_split >= block_size) {
        for (unsigned char i = 0; i < block_size;) {
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
        }
      } else {
        for (unsigned char i = 0; i < right_split;) {
          offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
        }
      }

      // Swap elements and update block sizes and first/last boundaries.
      size_t num = std::min(num_l, num_r);
      swap_offsets(
        offsets_l_base, offsets_r_base, 
        offsets_l + start_l, offsets_r + start_r,
        num, num_l == num_r
      );
      num_l -= num; num_r -= num;
      start_l += num; start_r += num;

      if (num_l == 0) {
        start_l = 0;
        offsets_l_base = first;
      }

      if (num_r == 0) {
        start_r = 0;
        offsets_r_base = last;
      }
    }

    // We have now fully identified [first, last)'s proper position. Swap the last elements.
    if (num_l) {
      offsets_l += start_l;
      while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
      first = last;
    }
    if (num_r) {
      offsets_r += start_r;
      while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
      last = first;
    }
  }

  // Put the pivot in the right place.
  Iter pivot_pos = first - 1;
  *begin = std::move(*pivot_pos);
  *pivot_pos = std::move(pivot);

  return std::make_pair(pivot_pos, already_partitioned);
}